

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft.c
# Opt level: O1

void aom_fft16x16_float_c(float *input,float *temp,float *output)

{
  ulong uVar1;
  ulong uVar2;
  int y;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  long lVar6;
  long lVar7;
  float fVar8;
  float fVar9;
  
  lVar7 = 0;
  do {
    aom_fft1d_16_float((float *)((long)input + lVar7),(float *)((long)output + lVar7),0x10);
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x40);
  lVar7 = 0;
  pfVar3 = output;
  pfVar4 = temp;
  do {
    lVar6 = 0;
    pfVar5 = pfVar3;
    do {
      pfVar4[lVar6] = *pfVar5;
      lVar6 = lVar6 + 1;
      pfVar5 = pfVar5 + 0x10;
    } while (lVar6 != 0x10);
    lVar7 = lVar7 + 1;
    pfVar4 = pfVar4 + 0x10;
    pfVar3 = pfVar3 + 1;
  } while (lVar7 != 0x10);
  lVar7 = 0;
  do {
    aom_fft1d_16_float((float *)((long)temp + lVar7),(float *)((long)output + lVar7),0x10);
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x40);
  lVar7 = 0;
  pfVar3 = output;
  pfVar4 = temp;
  do {
    lVar6 = 0;
    pfVar5 = pfVar3;
    do {
      pfVar4[lVar6] = *pfVar5;
      lVar6 = lVar6 + 1;
      pfVar5 = pfVar5 + 0x10;
    } while (lVar6 != 0x10);
    lVar7 = lVar7 + 1;
    pfVar4 = pfVar4 + 0x10;
    pfVar3 = pfVar3 + 1;
  } while (lVar7 != 0x10);
  pfVar5 = temp + 0x88;
  pfVar3 = output + 0x201;
  pfVar4 = output + 1;
  lVar7 = 0;
  do {
    uVar1 = lVar7 - 1;
    lVar6 = 0;
    do {
      uVar2 = lVar6 - 1;
      fVar8 = 0.0;
      fVar9 = 0.0;
      if (uVar2 < 7 && uVar1 < 7) {
        fVar9 = pfVar5[lVar6];
      }
      pfVar4[lVar6 * 2 + -1] = pfVar5[lVar6 + -0x88] - fVar9;
      if (uVar1 < 7) {
        fVar8 = pfVar5[lVar6 + -8];
      }
      fVar9 = 0.0;
      if (uVar2 < 7) {
        fVar9 = pfVar5[lVar6 + -0x80];
      }
      pfVar4[lVar6 * 2] = fVar8 + fVar9;
      if (uVar1 < 7) {
        fVar8 = 0.0;
        fVar9 = 0.0;
        if (uVar2 < 7 && uVar1 < 7) {
          fVar9 = pfVar5[lVar6];
        }
        pfVar3[lVar6 * 2 + -1] = fVar9 + pfVar5[lVar6 + -0x88];
        if (uVar2 < 7) {
          fVar8 = pfVar5[lVar6 + -0x80];
        }
        pfVar3[lVar6 * 2] = fVar8 - pfVar5[lVar6 + -8];
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != 9);
    lVar7 = lVar7 + 1;
    pfVar5 = pfVar5 + 0x10;
    pfVar3 = pfVar3 + -0x20;
    pfVar4 = pfVar4 + 0x20;
  } while (lVar7 != 9);
  return;
}

Assistant:

void aom_fft16x16_float_c(const float *input, float *temp, float *output) {
  aom_fft_2d_gen(input, temp, output, 16, aom_fft1d_16_float, simple_transpose,
                 unpack_2d_output, 1);
}